

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_amigahunk.c
# Opt level: O0

char * gethunkname(HunkInfo *hi)

{
  uint32_t uVar1;
  uint uVar2;
  long in_RDI;
  char *s;
  uint32_t n;
  char *__dest;
  undefined4 in_stack_fffffffffffffff0;
  undefined4 in_stack_fffffffffffffff4;
  
  __dest = (char *)0x0;
  uVar1 = nextword32((HunkInfo *)CONCAT44(in_stack_fffffffffffffff4,in_stack_fffffffffffffff0));
  uVar2 = uVar1 & 0xffffff;
  if (uVar2 != 0) {
    __dest = (char *)alloczero(CONCAT44(uVar1,in_stack_fffffffffffffff0) & 0xffffffffffffff);
    strncpy(__dest,*(char **)(in_RDI + 8),(ulong)(uVar2 << 2));
    movehunkptr32((HunkInfo *)CONCAT44(uVar2,in_stack_fffffffffffffff0),
                  (uint32_t)((ulong)__dest >> 0x20));
  }
  return __dest;
}

Assistant:

static char *gethunkname(struct HunkInfo *hi)
/* read 32-bit aligned name, the most significant byte of the */
/* length specifier is ignored (for HUNK_EXT names, for example) */
{
  uint32_t n;
  char *s=NULL;

  if (n = nextword32(hi) & 0xffffff) {  /* name given? */
    s = alloczero((n+1)<<2);
    strncpy(s,(char *)hi->hunkptr,n<<2);
    movehunkptr32(hi,n);
  }
  return s;
}